

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

void __thiscall polyscope::render::Engine::loadDefaultMaterials(Engine *this)

{
  string *in_stack_00000098;
  Engine *in_stack_000000a0;
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"clay",&local_29);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"wax",&local_61);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"candy",&local_89);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"flat",&local_b1);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"mud",&local_d9);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"ceramic",&local_101);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"jade",&local_129);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"normal",&local_151);
  loadDefaultMaterial(in_stack_000000a0,in_stack_00000098);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  return;
}

Assistant:

void Engine::loadDefaultMaterials() {
  loadDefaultMaterial("clay");
  loadDefaultMaterial("wax");
  loadDefaultMaterial("candy");
  loadDefaultMaterial("flat");
  loadDefaultMaterial("mud");
  loadDefaultMaterial("ceramic");
  loadDefaultMaterial("jade");
  loadDefaultMaterial("normal");
}